

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

char * read_letter(Lexer *lexer,CharBuff *buff)

{
  uint uVar1;
  char *pcVar2;
  
  do {
    uVar1 = read_chr(lexer);
    if (uVar1 == 0xc9) {
LAB_0010250b:
      pcVar2 = to_string(buff);
      return pcVar2;
    }
    if (((((uVar1 & 0xffffffdf) - 0x5b < 0xffffffe6) && (uVar1 != 0x24)) && (uVar1 != 0x5f)) &&
       (-1 < (int)uVar1 && 9 < uVar1 - 0x30)) {
      lexer->last_chr = uVar1;
      goto LAB_0010250b;
    }
    append_chr(buff,(char)uVar1);
  } while( true );
}

Assistant:

char *read_letter(Lexer *lexer, CharBuff* buff) {
    int chr;
    while ((chr = read_chr(lexer)) != END) {
        // a_9 | a$9
        if (is_letter(chr) || is_symbol(chr) || is_digit(chr) || chr < 0) {
            append_chr(buff, (char) chr);
        } else {
            unread_chr(lexer, chr);
            break;
        }
    }
    return to_string(buff);;
}